

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::processCommandInstruction(CoreBroker *this,ActionMessage *message)

{
  bool bVar1;
  __type_conflict _Var2;
  route_id rVar3;
  string *__lhs;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var4;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  GlobalFederateId fedid;
  ulong uVar5;
  string_view searchValue;
  string_view searchValue_00;
  string_view searchValue_01;
  string_view searchValue_02;
  
  fedid.gid = (message->dest_id).gid;
  if (fedid.gid == (this->super_BrokerBase).global_broker_id_local.gid) goto LAB_002ca947;
  if (fedid.gid != 0) {
LAB_002ca95b:
    rVar3 = getRoute(this,fedid);
    UNRECOVERED_JUMPTABLE_00 = (this->super_Broker)._vptr_Broker[0x23];
    (*UNRECOVERED_JUMPTABLE_00)(this,(ulong)(uint)rVar3.rid,message,UNRECOVERED_JUMPTABLE_00);
    return;
  }
  __lhs = ActionMessage::getString_abi_cxx11_(message,0);
  bVar1 = std::operator==(__lhs,"broker");
  if (bVar1) {
LAB_002ca947:
    processLocalCommandInstruction(this,message);
    return;
  }
  _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&(this->super_BrokerBase).identifier);
  if (_Var2) goto LAB_002ca947;
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    bVar1 = std::operator==(__lhs,"federation");
    if (bVar1) goto LAB_002ca947;
    bVar1 = std::operator==(__lhs,"root");
    if (bVar1) goto LAB_002ca947;
    searchValue._M_str = (__lhs->_M_dataplus)._M_p;
    searchValue._M_len = __lhs->_M_string_length;
    _Var4._M_current =
         (BasicBrokerInfo *)
         gmlc::containers::
         DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
         ::find(&this->mFederates,searchValue);
    if (_Var4._M_current ==
        (BasicBrokerInfo *)
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      searchValue_00._M_str = (__lhs->_M_dataplus)._M_p;
      searchValue_00._M_len = __lhs->_M_string_length;
      _Var4 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::find(&this->mBrokers,searchValue_00);
      if (_Var4._M_current ==
          (this->mBrokers).dataStorage.
          super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        ActionMessage::swapSourceDest(message);
        (message->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
        ActionMessage::setAction(message,cmd_error);
        SmallBuffer::operator=
                  (&message->payload,(char (*) [36])"unable to locate target for command");
        fedid.gid = (message->dest_id).gid;
        goto LAB_002ca95b;
      }
    }
  }
  else {
    searchValue_01._M_str = (__lhs->_M_dataplus)._M_p;
    searchValue_01._M_len = __lhs->_M_string_length;
    _Var4._M_current =
         (BasicBrokerInfo *)
         gmlc::containers::
         DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
         ::find(&this->mFederates,searchValue_01);
    if (_Var4._M_current ==
        (BasicBrokerInfo *)
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      searchValue_02._M_str = (__lhs->_M_dataplus)._M_p;
      searchValue_02._M_len = __lhs->_M_string_length;
      _Var4 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::find(&this->mBrokers,searchValue_02);
      if (_Var4._M_current ==
          (this->mBrokers).dataStorage.
          super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        UNRECOVERED_JUMPTABLE_00 = (this->super_Broker)._vptr_Broker[0x23];
        uVar5 = 0;
        goto LAB_002caaa6;
      }
    }
  }
  uVar5 = (ulong)(uint)((_Var4._M_current)->route).rid;
  (message->dest_id).gid = ((GlobalFederateId *)&(_Var4._M_current)->global_id)->gid;
  UNRECOVERED_JUMPTABLE_00 = (this->super_Broker)._vptr_Broker[0x23];
LAB_002caaa6:
  (*UNRECOVERED_JUMPTABLE_00)(this,uVar5,message);
  return;
}

Assistant:

void CoreBroker::processCommandInstruction(ActionMessage& message)
{
    if (message.dest_id == global_broker_id_local) {
        processLocalCommandInstruction(message);
    } else if (message.dest_id == parent_broker_id) {
        const auto& target = message.getString(targetStringLoc);
        if (target == "broker" || target == getIdentifier()) {
            processLocalCommandInstruction(message);
        } else if (isRootc) {
            if (target == "federation" || target == "root") {
                processLocalCommandInstruction(message);
            } else {
                route_id route = parent_route_id;
                auto fed = mFederates.find(target);
                if (fed != mFederates.end()) {
                    route = fed->route;
                    message.dest_id = fed->global_id;
                    transmit(route, std::move(message));
                } else {
                    auto broker = mBrokers.find(target);
                    if (broker != mBrokers.end()) {
                        route = broker->route;
                        message.dest_id = broker->global_id;
                        transmit(route, std::move(message));
                    } else {
                        message.swapSourceDest();
                        message.source_id = global_broker_id_local;
                        message.setAction(CMD_ERROR);
                        message.payload = "unable to locate target for command";
                        transmit(getRoute(message.dest_id), std::move(message));
                    }
                }
            }
        } else {
            route_id route = parent_route_id;
            auto fed = mFederates.find(target);
            if (fed != mFederates.end()) {
                route = fed->route;
                message.dest_id = fed->global_id;
                transmit(route, std::move(message));
            } else {
                auto broker = mBrokers.find(target);
                if (broker != mBrokers.end()) {
                    route = broker->route;
                    message.dest_id = broker->global_id;
                    transmit(route, std::move(message));
                } else {
                    transmit(parent_route_id, std::move(message));
                }
            }
        }
    } else {
        transmit(getRoute(message.dest_id), std::move(message));
    }
}